

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O0

char * duckdb_shell_sqlite3_mprintf(char *zFormat,...)

{
  char in_AL;
  char *pcVar1;
  __va_list_tag *in_XMM4_Qa;
  char *in_XMM4_Qb;
  char *z;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff88 = in_XMM4_Qa;
    in_stack_ffffffffffffff90 = in_XMM4_Qb;
  }
  pcVar1 = duckdb_shell_sqlite3_vmprintf(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return pcVar1;
}

Assistant:

char *sqlite3_mprintf(const char *zFormat, ...) {
	va_list ap;
	char *z;
	va_start(ap, zFormat);
	z = sqlite3_vmprintf(zFormat, ap);
	va_end(ap);
	return z;
}